

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O2

int run_test_thread_mutex_recursive(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_mutex_t mutex;
  
  iVar1 = uv_mutex_init_recursive(&mutex);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    uv_mutex_lock(&mutex);
    uv_mutex_lock(&mutex);
    iVar1 = uv_mutex_trylock(&mutex);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      uv_mutex_unlock(&mutex);
      uv_mutex_unlock(&mutex);
      uv_mutex_unlock(&mutex);
      uv_mutex_destroy(&mutex);
      return 0;
    }
    pcVar2 = "uv_mutex_trylock(&mutex)";
    uVar3 = 0x3e;
  }
  else {
    pcVar2 = "r";
    uVar3 = 0x3a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
          ,uVar3,pcVar2,"==","0",eval_a,"==",0);
  abort();
}

Assistant:

TEST_IMPL(thread_mutex_recursive) {
  uv_mutex_t mutex;
  int r;

  r = uv_mutex_init_recursive(&mutex);
  ASSERT_OK(r);

  uv_mutex_lock(&mutex);
  uv_mutex_lock(&mutex);
  ASSERT_OK(uv_mutex_trylock(&mutex));

  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);

  return 0;
}